

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_gravity.c
# Opt level: O1

void fsnav_ins_gravity_normal(void)

{
  fsnav_imu *pfVar1;
  fsnav_struct *pfVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pfVar2 = fsnav;
  pfVar1 = fsnav->imu;
  if (pfVar1 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      dVar5 = 1.0 - (fsnav->imu_const).e2;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      fsnav_ins_gravity_normal::f = 1.0 - dVar5;
      dVar6 = (fsnav->imu_const).u;
      dVar3 = (fsnav->imu_const).fg;
      dVar4 = 1.0 / ((dVar3 + 1.0) / dVar5 + -1.0);
      fsnav_ins_gravity_normal::m =
           1.0 / ((dVar4 + 0.3333333333333333) *
                  (((fsnav_ins_gravity_normal::f + dVar3) /
                   (dVar6 * dVar6 * (fsnav->imu_const).a * dVar5)) * (fsnav->imu_const).ge + -1.0) +
                  dVar4 + 1.0);
      fsnav_ins_gravity_normal::f4_4 =
           (fsnav_ins_gravity_normal::m * 5.0 - fsnav_ins_gravity_normal::f) *
           fsnav_ins_gravity_normal::f * 0.125;
    }
    else if (-1 < fsnav->mode) {
      pfVar1->g_valid = '\0';
      if ((pfVar1->sol).llh_valid == '\0') {
        if ((pfVar2->sol).llh_valid == '\0') {
          dVar5 = (pfVar2->imu_const).pi * 0.25;
          dVar6 = 0.0;
        }
        else {
          dVar5 = (pfVar2->sol).llh[1];
          dVar6 = (pfVar2->sol).llh[2];
        }
      }
      else {
        dVar5 = (pfVar1->sol).llh[1];
        dVar6 = (pfVar1->sol).llh[2];
      }
      dVar3 = sin(dVar5);
      dVar4 = sin(dVar5 + dVar5);
      dVar5 = cos(dVar5 + dVar5);
      pfVar2 = fsnav;
      dVar6 = dVar6 / (fsnav->imu_const).a;
      pfVar1 = fsnav->imu;
      pfVar1->g[0] = 0.0;
      pfVar1->g[1] = -(pfVar2->imu_const).fg * dVar4 * dVar6;
      pfVar1->g[2] = ((dVar5 * fsnav_ins_gravity_normal::f + 1.0 + fsnav_ins_gravity_normal::m) *
                      -2.0 * dVar6 + 1.0) *
                     (((pfVar2->imu_const).fg * dVar3 * dVar3 + 1.0) -
                     fsnav_ins_gravity_normal::f4_4 * dVar4 * dVar4) * -(pfVar2->imu_const).ge;
      pfVar1->g_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_gravity_normal(void) {

	static double
		f    = 0, // Earth ellipsoid flattening f = (a - b)/a
		m    = 0, // gravitational parameter, m = [u^2 a^2 b]/[GM], ratio between centrifugal and gravitational accelerations on the equator of a shpere having the same mass and volume as the Earth does
		f4_4 = 0; // coefficient for the second harmonic term, f4/4 = 5/2 f m - 1/2 f^2

	double 
		lat,	  // geographical latitude		
		h,		  // geographical altitude from reference ellipsoid
		sinlat,	  //   sine of latitude
		sin2lat,  //   sine of twofold latitude
		cos2lat,  // cosine of twofold latitude
		h_a,	  // ratio between altitude and ellipsoid semimajor axis
		b_a;	  // ratio between Earth ellipsoid semiminor and semimajor axes, b/a = sqrt(1 - e^2)


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init
		
		// ratio between Earth ellipsoid semiminor and semimajor axes
		b_a = sqrt(1 - fsnav->imu_const.e2); // b/a = sqrt(1 - e^2)
		// Earth ellipsoid flattening 
		f = 1 - b_a; // as from definitions: e^2 = (a^2 - b^2)/a^2, f = (a - b)/a
		// gravitational parameter, as derived from section 3 of Geodetic Reference System 80 by H. Moritz (GRS-80): 
			// from ge = GM/ab (1 - m - m/6 e'q0'/q0), 
			// and  gp = GM/a^2 (1 + m/3 e'q0'/q0), 
			// and  f + fg = u^2 b / ge (1 + e'/2 q0'/q0)
			// let  k   = 1/2 e'q0'/q0 = (f + fg)/(u^2 b) ge - 1, 
			// let  eps = 1 / (gp/ge*a/b - 1) = 1/((fg + 1)/sqrt(1 - e^2) - 1), 
			// then m   = 1/(k*(eps + 1/3) + eps + 1)
		f4_4 = (f + fsnav->imu_const.fg)/(fsnav->imu_const.u*fsnav->imu_const.u*fsnav->imu_const.a*b_a)*fsnav->imu_const.ge - 1; // use f4_4 variable instead of k
		m    = 1/((fsnav->imu_const.fg + 1)/b_a - 1);
		m    = 1/(f4_4*(m+1.0/3) + m + 1);
		// coefficient for the second harmonic term
		f4_4 = f/8*(5*m - f); // f4 = -1/2 f^2 + 5/2 f m, as in (2-115), Physical Geodesy, W.Heiskanen H.Moritz, 1993, p. 76, or section 3 of Geodetic Reference System 80 by H. Moritz (GRS-80), corrected for skipped minus sign

	}

	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}

	else						// main cycle
	{
		// validity flag down
		fsnav->imu->g_valid = 0;
		// define latitude and altitude
		if (fsnav->imu->sol.llh_valid) { // from imu data, if valid
			lat = fsnav->imu->sol.llh[1];
			h   = fsnav->imu->sol.llh[2];
		}
		else if (fsnav->sol.llh_valid) { // from hybrid solution, if valid
			lat = fsnav->sol.llh[1];
			h   = fsnav->sol.llh[2];
		}
		else {                          // default values
			lat = fsnav->imu_const.pi/4; 
			h   = 0;
		}
		sinlat  = sin(  lat);
		sin2lat = sin(2*lat);
		cos2lat = cos(2*lat);
		h_a = h/fsnav->imu_const.a;
		// Eastern component - zero for normal gravity
		fsnav->imu->g[0] = 0;
		// Northern deflection with altitude above ellipsoid from plumb line curvature, as in (5-34), Physical Geodesy, W.Heiskanen H.Moritz, 1993, p. 196
		fsnav->imu->g[1] = -fsnav->imu_const.fg*sin2lat*h_a;
		// vertical component, as from section 3 of Geodetic Reference System 80 by H. Moritz (GRS-80)
		fsnav->imu->g[2] = -fsnav->imu_const.ge*
			(1 + fsnav->imu_const.fg*sinlat*sinlat - f4_4*sin2lat*sin2lat)*
			(1 - 2*(1 + f*cos2lat + m)*h_a);
		// validity flag up
		fsnav->imu->g_valid = 1;

	}

}